

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O2

void __thiscall CTcGenTarg::build_synthesized_code(CTcGenTarg *this)

{
  CTcSymbol *local_20;
  int local_18;
  
  local_18 = 0;
  local_20 = CTcPrsSymtab::find(G_prs->global_symtab_,"_multiMethodCall",0x10);
  (G_cs_static->super_CTcDataStream).obj_file_start_ofs_ = (G_cs_static->super_CTcDataStream).ofs_;
  G_os->obj_file_start_ofs_ = G_os->ofs_;
  CTcPrsSymtab::enum_entries(G_prs->global_symtab_,multimethod_stub_cb,&local_20);
  if ((local_18 != 0) &&
     ((local_20 == (CTcSymbol *)0x0 ||
      (*(int *)&(local_20->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24
       != 1)))) {
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e32,"_multiMethodCall");
  }
  return;
}

Assistant:

void CTcGenTarg::build_synthesized_code()
{
    mmstub_ctx ctx;
    
    /* look up the _multiMethodCall function */
    ctx.mmc = (CTcSymFunc *)G_prs->get_global_symtab()->find(
        "_multiMethodCall", 16);

    /* 
     *   our generated code isn't part of any object file - flag a new object
     *   file so that we don't get confused into thinking this came from the
     *   last object file loaded 
     */
    G_cs_static->set_object_file_start_ofs();
    G_os->set_object_file_start_ofs();

    /* build out the stubs for the multi-method base functions */
    G_prs->get_global_symtab()->enum_entries(&multimethod_stub_cb, &ctx);

    /* 
     *   if we generated any stubs, we definitely need _multiMethodCall to be
     *   defined - if it's not, it's an error 
     */
    if (ctx.cnt != 0 && (ctx.mmc == 0 || ctx.mmc->get_type() != TC_SYM_FUNC))
    {
        G_tcmain->log_error(0, 0, TC_SEV_ERROR, TCERR_MISSING_MMREG,
                            "_multiMethodCall");
    }
}